

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O1

bool __thiscall Environment::hasSymbol(Environment *this,Identifier *ident)

{
  pointer __s2;
  _Hash_node_base *p_Var1;
  _Hash_node_base *__n;
  int iVar2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  
  p_Var3 = (this->symbols)._M_h._M_before_begin._M_nxt;
  bVar4 = p_Var3 != (_Hash_node_base *)0x0;
  if (bVar4) {
    __s2 = (ident->_M_dataplus)._M_p;
    p_Var1 = (_Hash_node_base *)ident->_M_string_length;
    do {
      __n = p_Var3[3]._M_nxt;
      if (__n == p_Var1) {
        if (__n == (_Hash_node_base *)0x0) {
          return bVar4;
        }
        iVar2 = bcmp(p_Var3[2]._M_nxt,__s2,(size_t)__n);
        if (iVar2 == 0) {
          return bVar4;
        }
      }
      p_Var3 = p_Var3->_M_nxt;
      bVar4 = p_Var3 != (_Hash_node_base *)0x0;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool Environment::hasSymbol(const Identifier& ident) {
    for(auto& it : symbols) {
        if(it.first.name == ident)
            return true;
    }
    return false;
}